

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackRPMGenerator.cxx
# Opt level: O3

int __thiscall cmCPackRPMGenerator::PackageComponents(cmCPackRPMGenerator *this,bool ignoreGroup)

{
  _Rb_tree_header *p_Var1;
  cmCPackLog *pcVar2;
  size_t sVar3;
  size_type sVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  _Alloc_hider _Var7;
  _Rb_tree_node_base *p_Var8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  char *__s;
  _Rb_tree_node_base *p_Var13;
  long *plVar14;
  _Base_ptr p_Var15;
  ostream *poVar16;
  size_type *psVar17;
  pointer pcVar18;
  undefined7 in_register_00000031;
  uint uVar19;
  _Alloc_hider _Var20;
  size_t sVar21;
  string mainComponentUpper;
  string component_4;
  string component;
  string initialTopLevel;
  string local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  _Rb_tree_node_base *local_220;
  string local_218;
  _Rb_tree_node_base *local_1f8;
  _Rb_tree_node_base *local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  undefined1 local_1c8 [112];
  ios_base local_158 [264];
  string local_50;
  
  local_220 = (_Rb_tree_node_base *)
              CONCAT44(local_220._4_4_,(int)CONCAT71(in_register_00000031,ignoreGroup));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&(this->super_cmCPackGenerator).packageFileNames,
                    (this->super_cmCPackGenerator).packageFileNames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pcVar18 = local_1c8 + 0x10;
  local_1c8._0_8_ = pcVar18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,"CPACK_TEMPORARY_DIRECTORY","");
  __s = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_1c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,__s,(allocator<char> *)&local_260);
  if ((pointer)local_1c8._0_8_ != pcVar18) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  local_1c8._0_8_ = pcVar18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"CPACK_RPM_MAIN_COMPONENT","")
  ;
  p_Var13 = (_Rb_tree_node_base *)
            cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_1c8);
  if ((pointer)local_1c8._0_8_ != pcVar18) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  local_1c8._0_8_ = pcVar18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,"CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE","");
  bVar9 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,(string *)local_1c8);
  local_1f0 = p_Var13;
  if (bVar9) {
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"CPACK_RPM_DEBUGINFO_PACKAGE","");
    bVar9 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    bVar9 = !bVar9;
  }
  else {
    bVar9 = false;
  }
  if ((pointer)local_1c8._0_8_ != pcVar18) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  if (bVar9) {
    if ((char)local_220 == '\0') {
      p_Var15 = (this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      p_Var1 = &(this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var15 != p_Var1) {
        do {
          local_1c8._0_8_ = local_1c8 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1c8,*(long *)(p_Var15 + 1),
                     (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1));
          uVar6 = local_1c8._8_8_;
          uVar5 = local_1c8._0_8_;
          if (local_1c8._8_8_ != 0) {
            sVar21 = 0;
            do {
              iVar11 = toupper((int)*(char *)(uVar5 + sVar21));
              *(char *)(uVar5 + sVar21) = (char)iVar11;
              sVar21 = sVar21 + 1;
            } while (uVar6 != sVar21);
          }
          std::operator+(&local_240,"CPACK_RPM_",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var15 + 1));
          plVar14 = (long *)std::__cxx11::string::append((char *)&local_240);
          psVar17 = (size_type *)(plVar14 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar17) {
            local_260.field_2._M_allocated_capacity = *psVar17;
            local_260.field_2._8_8_ = plVar14[3];
            local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
          }
          else {
            local_260.field_2._M_allocated_capacity = *psVar17;
            local_260._M_dataplus._M_p = (pointer)*plVar14;
          }
          local_260._M_string_length = plVar14[1];
          *plVar14 = (long)psVar17;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          bVar9 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_260);
          bVar10 = true;
          if (!bVar9) {
            std::operator+(&local_1e8,"CPACK_RPM_",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1c8);
            plVar14 = (long *)std::__cxx11::string::append((char *)&local_1e8);
            psVar17 = (size_type *)(plVar14 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar14 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar17) {
              local_218.field_2._M_allocated_capacity = *psVar17;
              local_218.field_2._8_8_ = plVar14[3];
              local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
            }
            else {
              local_218.field_2._M_allocated_capacity = *psVar17;
              local_218._M_dataplus._M_p = (pointer)*plVar14;
            }
            local_218._M_string_length = plVar14[1];
            *plVar14 = (long)psVar17;
            plVar14[1] = 0;
            *(undefined1 *)(plVar14 + 2) = 0;
            bVar10 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_218);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p != &local_218.field_2) {
              operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
              operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_240._M_dataplus._M_p != &local_240.field_2) {
            operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
            operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
          }
          if (bVar10 != false) goto LAB_001777a1;
          p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
        } while ((_Rb_tree_header *)p_Var15 != p_Var1);
      }
      p_Var15 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      p_Var13 = &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                 _M_header;
      if (p_Var15 != p_Var13) {
        local_1f8 = p_Var13;
        do {
          if (*(long *)(p_Var15 + 4) == 0) {
            local_1c8._0_8_ = local_1c8 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1c8,*(long *)(p_Var15 + 1),
                       (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1));
            uVar6 = local_1c8._8_8_;
            uVar5 = local_1c8._0_8_;
            if (local_1c8._8_8_ != 0) {
              sVar21 = 0;
              do {
                iVar11 = toupper((int)*(char *)(uVar5 + sVar21));
                *(char *)(uVar5 + sVar21) = (char)iVar11;
                sVar21 = sVar21 + 1;
              } while (uVar6 != sVar21);
            }
            std::operator+(&local_240,"CPACK_RPM_",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var15 + 1));
            plVar14 = (long *)std::__cxx11::string::append((char *)&local_240);
            psVar17 = (size_type *)(plVar14 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar14 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar17) {
              local_260.field_2._M_allocated_capacity = *psVar17;
              local_260.field_2._8_8_ = plVar14[3];
              local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
            }
            else {
              local_260.field_2._M_allocated_capacity = *psVar17;
              local_260._M_dataplus._M_p = (pointer)*plVar14;
            }
            local_260._M_string_length = plVar14[1];
            *plVar14 = (long)psVar17;
            plVar14[1] = 0;
            *(undefined1 *)(plVar14 + 2) = 0;
            bVar9 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_260);
            bVar10 = true;
            if (!bVar9) {
              std::operator+(&local_1e8,"CPACK_RPM_",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1c8);
              plVar14 = (long *)std::__cxx11::string::append((char *)&local_1e8);
              psVar17 = (size_type *)(plVar14 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar14 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar17) {
                local_218.field_2._M_allocated_capacity = *psVar17;
                local_218.field_2._8_8_ = plVar14[3];
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
              }
              else {
                local_218.field_2._M_allocated_capacity = *psVar17;
                local_218._M_dataplus._M_p = (pointer)*plVar14;
              }
              local_218._M_string_length = plVar14[1];
              *plVar14 = (long)psVar17;
              plVar14[1] = 0;
              *(undefined1 *)(plVar14 + 2) = 0;
              bVar10 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_218);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._M_dataplus._M_p != &local_218.field_2) {
                operator_delete(local_218._M_dataplus._M_p,
                                local_218.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                operator_delete(local_1e8._M_dataplus._M_p,
                                local_1e8.field_2._M_allocated_capacity + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p != &local_260.field_2) {
              operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_240._M_dataplus._M_p != &local_240.field_2) {
              operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1
                             );
            }
            if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
              operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
            }
            p_Var13 = local_1f8;
            if (bVar10 != false) goto LAB_001777a1;
          }
          p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
        } while (p_Var15 != p_Var13);
      }
    }
    else {
      p_Var15 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      p_Var1 = &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var15 != p_Var1) {
        do {
          local_1c8._0_8_ = local_1c8 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1c8,*(long *)(p_Var15 + 1),
                     (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1));
          uVar6 = local_1c8._8_8_;
          uVar5 = local_1c8._0_8_;
          if (local_1c8._8_8_ != 0) {
            sVar21 = 0;
            do {
              iVar11 = toupper((int)*(char *)(uVar5 + sVar21));
              *(char *)(uVar5 + sVar21) = (char)iVar11;
              sVar21 = sVar21 + 1;
            } while (uVar6 != sVar21);
          }
          std::operator+(&local_240,"CPACK_RPM_",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var15 + 1));
          plVar14 = (long *)std::__cxx11::string::append((char *)&local_240);
          psVar17 = (size_type *)(plVar14 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar17) {
            local_260.field_2._M_allocated_capacity = *psVar17;
            local_260.field_2._8_8_ = plVar14[3];
            local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
          }
          else {
            local_260.field_2._M_allocated_capacity = *psVar17;
            local_260._M_dataplus._M_p = (pointer)*plVar14;
          }
          local_260._M_string_length = plVar14[1];
          *plVar14 = (long)psVar17;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          bVar9 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_260);
          bVar10 = true;
          if (!bVar9) {
            std::operator+(&local_1e8,"CPACK_RPM_",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1c8);
            plVar14 = (long *)std::__cxx11::string::append((char *)&local_1e8);
            psVar17 = (size_type *)(plVar14 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar14 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar17) {
              local_218.field_2._M_allocated_capacity = *psVar17;
              local_218.field_2._8_8_ = plVar14[3];
              local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
            }
            else {
              local_218.field_2._M_allocated_capacity = *psVar17;
              local_218._M_dataplus._M_p = (pointer)*plVar14;
            }
            local_218._M_string_length = plVar14[1];
            *plVar14 = (long)psVar17;
            plVar14[1] = 0;
            *(undefined1 *)(plVar14 + 2) = 0;
            bVar10 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_218);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p != &local_218.field_2) {
              operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
              operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_240._M_dataplus._M_p != &local_240.field_2) {
            operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
            operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
          }
          if (bVar10 != false) goto LAB_001777a1;
          p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
        } while ((_Rb_tree_header *)p_Var15 != p_Var1);
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"Setting ",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"CPACK_RPM_DEBUGINFO_PACKAGE because ",0x24);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE is set but ",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8," none of the ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"CPACK_RPM_<component>_DEBUGINFO_PACKAGE variables ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"are set.",8);
    std::ios::widen((char)(ostream *)local_1c8 + (char)*(undefined8 *)(local_1c8._0_8_ + -0x18));
    std::ostream::put((char)local_1c8);
    std::ostream::flush();
    pcVar2 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    _Var7._M_p = local_260._M_dataplus._M_p;
    sVar21 = strlen(local_260._M_dataplus._M_p);
    cmCPackLog::Log(pcVar2,2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                    ,0xaa,_Var7._M_p,sVar21);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    std::ios_base::~ios_base(local_158);
    local_1c8._0_8_ = local_1c8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,"CPACK_RPM_DEBUGINFO_PACKAGE","");
    cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,(string *)local_1c8,"ON");
    if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
  }
LAB_001777a1:
  p_Var13 = local_1f0;
  pcVar18 = local_1c8 + 0x10;
  local_1c8._0_8_ = pcVar18;
  if (local_1f0 != (_Rb_tree_node_base *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,"CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE","");
    bVar9 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,(string *)local_1c8);
    if ((pointer)local_1c8._0_8_ != pcVar18) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    if (bVar9) {
      local_1c8._0_8_ = pcVar18;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"GENERATE_SPEC_PARTS","");
      cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,(string *)local_1c8,"ON");
      if ((pointer)local_1c8._0_8_ != pcVar18) {
        operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
      }
    }
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    sVar21 = strlen((char *)p_Var13);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,p_Var13,(long)&p_Var13->_M_color + sVar21);
    sVar4 = local_260._M_string_length;
    _Var7._M_p = local_260._M_dataplus._M_p;
    if (local_260._M_string_length != 0) {
      sVar21 = 0;
      do {
        iVar11 = toupper((int)_Var7._M_p[sVar21]);
        _Var7._M_p[sVar21] = (char)iVar11;
        sVar21 = sVar21 + 1;
      } while (sVar4 != sVar21);
    }
    if ((char)local_220 == '\0') {
      p_Var13 = &(this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header.
                 _M_header;
      p_Var15 = (this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      uVar19 = 1;
      local_220 = p_Var13;
      local_1f0 = p_Var13;
      if (p_Var15 != p_Var13) {
        do {
          local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_240,*(long *)(p_Var15 + 1),
                     (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1));
          sVar4 = local_240._M_string_length;
          _Var7._M_p = local_240._M_dataplus._M_p;
          p_Var8 = p_Var15;
          if (local_240._M_string_length == 0) {
            _Var20._M_p = local_240._M_dataplus._M_p;
            if (local_260._M_string_length != 0) goto LAB_00177c42;
          }
          else {
            sVar21 = 0;
            do {
              iVar11 = toupper((int)_Var7._M_p[sVar21]);
              p_Var13 = local_220;
              _Var20._M_p = local_240._M_dataplus._M_p;
              _Var7._M_p[sVar21] = (char)iVar11;
              sVar21 = sVar21 + 1;
            } while (sVar4 != sVar21);
            if ((local_260._M_string_length != local_240._M_string_length) ||
               ((local_240._M_string_length != 0 &&
                (iVar11 = bcmp(local_260._M_dataplus._M_p,local_240._M_dataplus._M_p,
                               local_240._M_string_length), iVar11 != 0)))) {
LAB_00177c42:
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1c8,"Packaging component group: ",0x1b);
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1c8,*(char **)(p_Var15 + 1),
                                   (long)p_Var15[1]._M_parent);
              std::ios::widen((char)poVar16->_vptr_basic_ostream[-3] + (char)poVar16);
              std::ostream::put((char)poVar16);
              std::ostream::flush();
              pcVar2 = (this->super_cmCPackGenerator).Logger;
              std::__cxx11::stringbuf::str();
              _Var7._M_p = local_218._M_dataplus._M_p;
              sVar21 = strlen(local_218._M_dataplus._M_p);
              cmCPackLog::Log(pcVar2,2,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                              ,0xcd,_Var7._M_p,sVar21);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._M_dataplus._M_p != &local_218.field_2) {
                operator_delete(local_218._M_dataplus._M_p,
                                local_218.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
              std::ios_base::~ios_base(local_158);
              uVar12 = PackageOnePack(this,&local_50,(string *)(p_Var15 + 1));
              uVar19 = uVar19 & uVar12;
              _Var20._M_p = local_240._M_dataplus._M_p;
              p_Var8 = local_1f0;
            }
          }
          local_1f0 = p_Var8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var20._M_p != &local_240.field_2) {
            operator_delete(_Var20._M_p,local_240.field_2._M_allocated_capacity + 1);
          }
          p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
        } while (p_Var15 != p_Var13);
      }
      p_Var1 = &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header;
      p_Var13 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      local_1f8 = &p_Var1->_M_header;
      _Var7._M_p = local_240._M_dataplus._M_p;
      while ((_Rb_tree_header *)p_Var13 != p_Var1) {
        local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
        if (*(long *)(p_Var13 + 4) == 0) {
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_240,*(long *)(p_Var13 + 1),
                     (long)&(p_Var13[1]._M_parent)->_M_color + *(long *)(p_Var13 + 1));
          sVar4 = local_240._M_string_length;
          _Var7._M_p = local_240._M_dataplus._M_p;
          p_Var8 = p_Var13;
          if (local_240._M_string_length == 0) {
            _Var20._M_p = local_240._M_dataplus._M_p;
            if (local_260._M_string_length != 0) goto LAB_00178132;
          }
          else {
            sVar21 = 0;
            do {
              iVar11 = toupper((int)_Var7._M_p[sVar21]);
              _Var20._M_p = local_240._M_dataplus._M_p;
              _Var7._M_p[sVar21] = (char)iVar11;
              sVar21 = sVar21 + 1;
            } while (sVar4 != sVar21);
            if ((local_260._M_string_length != local_240._M_string_length) ||
               ((local_240._M_string_length != 0 &&
                (iVar11 = bcmp(local_260._M_dataplus._M_p,local_240._M_dataplus._M_p,
                               local_240._M_string_length), iVar11 != 0)))) {
LAB_00178132:
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1c8,"Component <",0xb);
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1c8,*(char **)(p_Var13 + 2),
                                   (long)p_Var13[2]._M_parent);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar16,"> does not belong to any group, package it separately.",0x36);
              std::ios::widen((char)poVar16->_vptr_basic_ostream[-3] + (char)poVar16);
              std::ostream::put((char)poVar16);
              std::ostream::flush();
              pcVar2 = (this->super_cmCPackGenerator).Logger;
              std::__cxx11::stringbuf::str();
              _Var7._M_p = local_218._M_dataplus._M_p;
              sVar21 = strlen(local_218._M_dataplus._M_p);
              cmCPackLog::Log(pcVar2,2,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                              ,0xe7,_Var7._M_p,sVar21);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._M_dataplus._M_p != &local_218.field_2) {
                operator_delete(local_218._M_dataplus._M_p,
                                local_218.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
              std::ios_base::~ios_base(local_158);
              uVar12 = PackageOnePack(this,&local_50,(string *)(p_Var13 + 1));
              uVar19 = uVar19 & uVar12;
              _Var20._M_p = local_240._M_dataplus._M_p;
              p_Var8 = local_1f8;
            }
          }
          local_1f8 = p_Var8;
          _Var7._M_p = local_240._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var20._M_p != &local_240.field_2) {
            operator_delete(_Var20._M_p,local_240.field_2._M_allocated_capacity + 1);
            _Var7._M_p = local_240._M_dataplus._M_p;
          }
        }
        local_240._M_dataplus._M_p = _Var7._M_p;
        p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
        _Var7._M_p = local_240._M_dataplus._M_p;
      }
      uVar12 = 0;
      local_240._M_dataplus._M_p = _Var7._M_p;
      if (uVar19 != 0) {
        local_1c8._0_8_ = local_1c8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c8,"GENERATE_SPEC_PARTS","");
        cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,(string *)local_1c8,"OFF");
        if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
          operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
        }
        p_Var13 = local_1f0;
        if ((local_1f0 == local_220) &&
           (p_Var13 = local_1f8, (_Rb_tree_header *)local_1f8 == p_Var1)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1c8,"CPACK_RPM_MAIN_COMPONENT set",0x1c);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1c8," to non existing component.\n",0x1c);
          pcVar2 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          _Var7._M_p = local_240._M_dataplus._M_p;
          sVar21 = strlen(local_240._M_dataplus._M_p);
          cmCPackLog::Log(pcVar2,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                          ,0xf6,_Var7._M_p,sVar21);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_240._M_dataplus._M_p != &local_240.field_2) {
            operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
          std::ios_base::~ios_base(local_158);
        }
        else {
          uVar12 = PackageOnePack(this,&local_50,(string *)(p_Var13 + 1));
        }
      }
    }
    else {
      p_Var1 = &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header;
      p_Var15 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      p_Var13 = &p_Var1->_M_header;
      if ((_Rb_tree_header *)p_Var15 != p_Var1) {
        uVar19 = 1;
        local_220 = &p_Var1->_M_header;
        do {
          local_1c8._0_8_ = local_1c8 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1c8,*(long *)(p_Var15 + 1),
                     (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1));
          uVar6 = local_1c8._8_8_;
          uVar5 = local_1c8._0_8_;
          p_Var13 = p_Var15;
          if (local_1c8._8_8_ == 0) {
            pcVar18 = (pointer)local_1c8._0_8_;
            if (local_260._M_string_length != 0) goto LAB_0017795f;
          }
          else {
            sVar21 = 0;
            do {
              iVar11 = toupper((int)*(char *)(uVar5 + sVar21));
              pcVar18 = (pointer)local_1c8._0_8_;
              *(char *)(uVar5 + sVar21) = (char)iVar11;
              sVar21 = sVar21 + 1;
            } while (uVar6 != sVar21);
            if ((local_260._M_string_length != local_1c8._8_8_) ||
               ((local_1c8._8_8_ != 0 &&
                (iVar11 = bcmp(local_260._M_dataplus._M_p,(void *)local_1c8._0_8_,local_1c8._8_8_),
                iVar11 != 0)))) {
LAB_0017795f:
              uVar12 = PackageOnePack(this,&local_50,(string *)(p_Var15 + 1));
              uVar19 = uVar19 & uVar12;
              pcVar18 = (pointer)local_1c8._0_8_;
              p_Var13 = local_220;
            }
          }
          local_220 = p_Var13;
          if (pcVar18 != local_1c8 + 0x10) {
            operator_delete(pcVar18,local_1c8._16_8_ + 1);
          }
          p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
        } while ((_Rb_tree_header *)p_Var15 != p_Var1);
        p_Var13 = local_220;
        if (uVar19 == 0) {
          uVar12 = 0;
          goto LAB_001784c6;
        }
      }
      local_1c8._0_8_ = local_1c8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"GENERATE_SPEC_PARTS","");
      cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,(string *)local_1c8,"OFF");
      if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
        operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
      }
      if ((_Rb_tree_header *)p_Var13 == p_Var1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c8,"CPACK_RPM_MAIN_COMPONENT set",0x1c);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c8," to non existing component.\n",0x1c);
        pcVar2 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        _Var7._M_p = local_240._M_dataplus._M_p;
        sVar21 = strlen(local_240._M_dataplus._M_p);
        cmCPackLog::Log(pcVar2,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                        ,0x119,_Var7._M_p,sVar21);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
        std::ios_base::~ios_base(local_158);
        uVar12 = 0;
      }
      else {
        uVar12 = PackageOnePack(this,&local_50,(string *)(p_Var13 + 1));
      }
    }
LAB_001784c6:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    goto LAB_001784dd;
  }
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,"CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE","");
  bVar9 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,(string *)local_1c8);
  if (bVar9) {
    sVar3 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
            _M_node_count;
    if ((pointer)local_1c8._0_8_ != pcVar18) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    if (sVar3 == 1) goto LAB_00177d9c;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"CPACK_RPM_MAIN_COMPONENT not set but",0x24);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8," it is mandatory with CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE",0x38)
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8," being set.\n",0xc);
    pcVar2 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    _Var7._M_p = local_260._M_dataplus._M_p;
    sVar21 = strlen(local_260._M_dataplus._M_p);
    cmCPackLog::Log(pcVar2,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                    ,0x149,_Var7._M_p,sVar21);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    std::ios_base::~ios_base(local_158);
LAB_001784ec:
    uVar12 = 0;
  }
  else {
    if ((pointer)local_1c8._0_8_ != pcVar18) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
LAB_00177d9c:
    if ((char)local_220 == '\0') {
      p_Var15 = (this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      p_Var1 = &(this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header;
      uVar12 = 1;
      if ((_Rb_tree_header *)p_Var15 != p_Var1) {
        do {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1c8,"Packaging component group: ",0x1b);
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1c8,*(char **)(p_Var15 + 1),
                               (long)p_Var15[1]._M_parent);
          std::ios::widen((char)poVar16->_vptr_basic_ostream[-3] + (char)poVar16);
          std::ostream::put((char)poVar16);
          std::ostream::flush();
          pcVar2 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          _Var7._M_p = local_260._M_dataplus._M_p;
          sVar21 = strlen(local_260._M_dataplus._M_p);
          cmCPackLog::Log(pcVar2,2,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                          ,0x128,_Var7._M_p,sVar21);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
          std::ios_base::~ios_base(local_158);
          uVar19 = PackageOnePack(this,&local_50,(string *)(p_Var15 + 1));
          uVar12 = uVar12 & uVar19;
          p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
        } while ((_Rb_tree_header *)p_Var15 != p_Var1);
      }
      p_Var15 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      p_Var1 = &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var15 != p_Var1) {
        do {
          if (*(long *)(p_Var15 + 4) == 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1c8,"Component <",0xb);
            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1c8,*(char **)(p_Var15 + 2),
                                 (long)p_Var15[2]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar16,"> does not belong to any group, package it separately.",0x36);
            std::ios::widen((char)poVar16->_vptr_basic_ostream[-3] + (char)poVar16);
            std::ostream::put((char)poVar16);
            std::ostream::flush();
            pcVar2 = (this->super_cmCPackGenerator).Logger;
            std::__cxx11::stringbuf::str();
            _Var7._M_p = local_260._M_dataplus._M_p;
            sVar21 = strlen(local_260._M_dataplus._M_p);
            cmCPackLog::Log(pcVar2,2,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                            ,0x136,_Var7._M_p,sVar21);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p != &local_260.field_2) {
              operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
            std::ios_base::~ios_base(local_158);
            uVar19 = PackageOnePack(this,&local_50,(string *)(p_Var15 + 1));
            uVar12 = uVar12 & uVar19;
          }
          p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
        } while ((_Rb_tree_header *)p_Var15 != p_Var1);
      }
LAB_001784dd:
      if (uVar12 == 0) goto LAB_001784ec;
    }
    else {
      p_Var15 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      p_Var1 = &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header;
      uVar12 = 1;
      if ((_Rb_tree_header *)p_Var15 != p_Var1) {
        uVar12 = 1;
        do {
          uVar19 = PackageOnePack(this,&local_50,(string *)(p_Var15 + 1));
          uVar12 = uVar12 & uVar19;
          p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
        } while ((_Rb_tree_header *)p_Var15 != p_Var1);
        goto LAB_001784dd;
      }
    }
    AddGeneratedPackageNames(this);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return uVar12;
}

Assistant:

int cmCPackRPMGenerator::PackageComponents(bool ignoreGroup)
{
  int retval = 1;
  /* Reset package file name list it will be populated during the
   * component packaging run*/
  packageFileNames.clear();
  std::string initialTopLevel(this->GetOption("CPACK_TEMPORARY_DIRECTORY"));

  const char* mainComponent = this->GetOption("CPACK_RPM_MAIN_COMPONENT");

  if (this->IsOn("CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE") &&
      !this->IsOn("CPACK_RPM_DEBUGINFO_PACKAGE")) {
    // check if we need to set CPACK_RPM_DEBUGINFO_PACKAGE because non of
    // the components is setting per component debuginfo package variable
    bool shouldSet = true;

    if (ignoreGroup) {
      std::map<std::string, cmCPackComponent>::iterator compIt;
      for (compIt = this->Components.begin(); compIt != this->Components.end();
           ++compIt) {
        std::string component(compIt->first);
        std::transform(component.begin(), component.end(), component.begin(),
                       ::toupper);

        if (this->IsOn("CPACK_RPM_" + compIt->first + "_DEBUGINFO_PACKAGE") ||
            this->IsOn("CPACK_RPM_" + component + "_DEBUGINFO_PACKAGE")) {
          shouldSet = false;
          break;
        }
      }
    } else {
      std::map<std::string, cmCPackComponentGroup>::iterator compGIt;
      for (compGIt = this->ComponentGroups.begin();
           compGIt != this->ComponentGroups.end(); ++compGIt) {
        std::string component(compGIt->first);
        std::transform(component.begin(), component.end(), component.begin(),
                       ::toupper);

        if (this->IsOn("CPACK_RPM_" + compGIt->first + "_DEBUGINFO_PACKAGE") ||
            this->IsOn("CPACK_RPM_" + component + "_DEBUGINFO_PACKAGE")) {
          shouldSet = false;
          break;
        }
      }

      if (shouldSet) {
        std::map<std::string, cmCPackComponent>::iterator compIt;
        for (compIt = this->Components.begin();
             compIt != this->Components.end(); ++compIt) {
          // Does the component belong to a group?
          if (compIt->second.Group == nullptr) {
            std::string component(compIt->first);
            std::transform(component.begin(), component.end(),
                           component.begin(), ::toupper);

            if (this->IsOn("CPACK_RPM_" + compIt->first +
                           "_DEBUGINFO_PACKAGE") ||
                this->IsOn("CPACK_RPM_" + component + "_DEBUGINFO_PACKAGE")) {
              shouldSet = false;
              break;
            }
          }
        }
      }
    }

    if (shouldSet) {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                    "Setting "
                      << "CPACK_RPM_DEBUGINFO_PACKAGE because "
                      << "CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE is set but "
                      << " none of the "
                      << "CPACK_RPM_<component>_DEBUGINFO_PACKAGE variables "
                      << "are set." << std::endl);
      this->SetOption("CPACK_RPM_DEBUGINFO_PACKAGE", "ON");
    }
  }

  if (mainComponent) {
    if (this->IsOn("CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE")) {
      this->SetOption("GENERATE_SPEC_PARTS", "ON");
    }

    std::string mainComponentUpper(mainComponent);
    std::transform(mainComponentUpper.begin(), mainComponentUpper.end(),
                   mainComponentUpper.begin(), ::toupper);

    // The default behavior is to have one package by component group
    // unless CPACK_COMPONENTS_IGNORE_GROUP is specified.
    if (!ignoreGroup) {
      std::map<std::string, cmCPackComponentGroup>::iterator mainCompGIt =
        this->ComponentGroups.end();

      std::map<std::string, cmCPackComponentGroup>::iterator compGIt;
      for (compGIt = this->ComponentGroups.begin();
           compGIt != this->ComponentGroups.end(); ++compGIt) {
        std::string component(compGIt->first);
        std::transform(component.begin(), component.end(), component.begin(),
                       ::toupper);

        if (mainComponentUpper == component) {
          // main component will be handled last
          mainCompGIt = compGIt;
          continue;
        }

        cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                      "Packaging component group: " << compGIt->first
                                                    << std::endl);
        retval &= PackageOnePack(initialTopLevel, compGIt->first);
      }
      // Handle Orphan components (components not belonging to any groups)
      std::map<std::string, cmCPackComponent>::iterator mainCompIt =
        this->Components.end();
      std::map<std::string, cmCPackComponent>::iterator compIt;
      for (compIt = this->Components.begin(); compIt != this->Components.end();
           ++compIt) {
        // Does the component belong to a group?
        if (compIt->second.Group == nullptr) {
          std::string component(compIt->first);
          std::transform(component.begin(), component.end(), component.begin(),
                         ::toupper);

          if (mainComponentUpper == component) {
            // main component will be handled last
            mainCompIt = compIt;
            continue;
          }

          cmCPackLogger(
            cmCPackLog::LOG_VERBOSE,
            "Component <"
              << compIt->second.Name
              << "> does not belong to any group, package it separately."
              << std::endl);
          retval &= PackageOnePack(initialTopLevel, compIt->first);
        }
      }

      if (retval) {
        this->SetOption("GENERATE_SPEC_PARTS", "OFF");

        if (mainCompGIt != this->ComponentGroups.end()) {
          retval &= PackageOnePack(initialTopLevel, mainCompGIt->first);
        } else if (mainCompIt != this->Components.end()) {
          retval &= PackageOnePack(initialTopLevel, mainCompIt->first);
        } else {
          cmCPackLogger(cmCPackLog::LOG_ERROR,
                        "CPACK_RPM_MAIN_COMPONENT set"
                          << " to non existing component.\n");
          retval = 0;
        }
      }
    }
    // CPACK_COMPONENTS_IGNORE_GROUPS is set
    // We build 1 package per component
    else {
      std::map<std::string, cmCPackComponent>::iterator mainCompIt =
        this->Components.end();

      std::map<std::string, cmCPackComponent>::iterator compIt;
      for (compIt = this->Components.begin(); compIt != this->Components.end();
           ++compIt) {
        std::string component(compIt->first);
        std::transform(component.begin(), component.end(), component.begin(),
                       ::toupper);

        if (mainComponentUpper == component) {
          // main component will be handled last
          mainCompIt = compIt;
          continue;
        }

        retval &= PackageOnePack(initialTopLevel, compIt->first);
      }

      if (retval) {
        this->SetOption("GENERATE_SPEC_PARTS", "OFF");

        if (mainCompIt != this->Components.end()) {
          retval &= PackageOnePack(initialTopLevel, mainCompIt->first);
        } else {
          cmCPackLogger(cmCPackLog::LOG_ERROR,
                        "CPACK_RPM_MAIN_COMPONENT set"
                          << " to non existing component.\n");
          retval = 0;
        }
      }
    }
  } else if (!this->IsOn("CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE") ||
             this->Components.size() == 1) {
    // The default behavior is to have one package by component group
    // unless CPACK_COMPONENTS_IGNORE_GROUP is specified.
    if (!ignoreGroup) {
      std::map<std::string, cmCPackComponentGroup>::iterator compGIt;
      for (compGIt = this->ComponentGroups.begin();
           compGIt != this->ComponentGroups.end(); ++compGIt) {
        cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                      "Packaging component group: " << compGIt->first
                                                    << std::endl);
        retval &= PackageOnePack(initialTopLevel, compGIt->first);
      }
      // Handle Orphan components (components not belonging to any groups)
      std::map<std::string, cmCPackComponent>::iterator compIt;
      for (compIt = this->Components.begin(); compIt != this->Components.end();
           ++compIt) {
        // Does the component belong to a group?
        if (compIt->second.Group == nullptr) {
          cmCPackLogger(
            cmCPackLog::LOG_VERBOSE,
            "Component <"
              << compIt->second.Name
              << "> does not belong to any group, package it separately."
              << std::endl);
          retval &= PackageOnePack(initialTopLevel, compIt->first);
        }
      }
    }
    // CPACK_COMPONENTS_IGNORE_GROUPS is set
    // We build 1 package per component
    else {
      std::map<std::string, cmCPackComponent>::iterator compIt;
      for (compIt = this->Components.begin(); compIt != this->Components.end();
           ++compIt) {
        retval &= PackageOnePack(initialTopLevel, compIt->first);
      }
    }
  } else {
    cmCPackLogger(
      cmCPackLog::LOG_ERROR,
      "CPACK_RPM_MAIN_COMPONENT not set but"
        << " it is mandatory with CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE"
        << " being set.\n");
    retval = 0;
  }

  if (retval) {
    AddGeneratedPackageNames();
  }

  return retval;
}